

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_afalg.c
# Opt level: O0

void afalg_set_iv_sk(cmsghdr *cmsg,uchar *iv,uint len)

{
  uint in_EDX;
  void *in_RSI;
  long *in_RDI;
  af_alg_iv *aiv;
  
  *(undefined4 *)(in_RDI + 1) = 0x117;
  *(undefined4 *)((long)in_RDI + 0xc) = 2;
  *in_RDI = (ulong)in_EDX + 0x14;
  *(uint *)(in_RDI + 2) = in_EDX;
  memcpy((void *)((long)in_RDI + 0x14),in_RSI,(ulong)in_EDX);
  return;
}

Assistant:

static void afalg_set_iv_sk(struct cmsghdr *cmsg, const unsigned char *iv,
                            const unsigned int len)
{
    struct af_alg_iv *aiv;

    cmsg->cmsg_level = SOL_ALG;
    cmsg->cmsg_type = ALG_SET_IV;
    cmsg->cmsg_len = CMSG_LEN(ALG_IV_LEN(len));
    aiv = (struct af_alg_iv *)CMSG_DATA(cmsg);
    aiv->ivlen = len;
    memcpy(aiv->iv, iv, len);
}